

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoDiamondAAreHigh.h
# Opt level: O0

int __thiscall
TwoDiamondAAreHigh::getHighestCardID
          (TwoDiamondAAreHigh *this,int previous,vector<Card,_std::allocator<Card>_> *cards)

{
  bool bVar1;
  const_iterator __first;
  difference_type dVar2;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_50;
  Card local_48;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_40;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_38;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> local_30;
  __normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_> it;
  vector<Card,_std::allocator<Card>_> *cards_local;
  int previous_local;
  TwoDiamondAAreHigh *this_local;
  
  it._M_current = (Card *)cards;
  local_38._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::begin(cards);
  local_40._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(it._M_current);
  Card::Card(&local_48,DIAMONDS,ASS);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>,Card>
                       (local_38,local_40,&local_48);
  local_50._M_current = (Card *)std::vector<Card,_std::allocator<Card>_>::end(it._M_current);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
  this_local._4_4_ = previous;
  if (bVar1) {
    __first = std::vector<Card,_std::allocator<Card>_>::begin(it._M_current);
    dVar2 = std::
            distance<__gnu_cxx::__normal_iterator<Card_const*,std::vector<Card,std::allocator<Card>>>>
                      ((__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
                       __first._M_current,local_30);
    this_local._4_4_ = (int)dVar2;
  }
  return this_local._4_4_;
}

Assistant:

virtual int getHighestCardID(int previous, const std::vector<Card> &cards){
        auto it = std::find(cards.begin(), cards.end(), Card(Suit::DIAMONDS, CardValue::ASS));
        if(it != cards.end()){
           return (int) std::distance(cards.begin(), it);
        } else {
            return previous;
        }
    }